

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

int __thiscall ghc::filesystem::path::compare(path *this,path *p)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  string *psVar8;
  size_type sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  psVar8 = (string *)root_name_length(this);
  sVar9 = root_name_length(p);
  uVar7 = std::__cxx11::string::compare((ulong)this,0,psVar8,(ulong)p,0);
  if (uVar7 == 0) {
    bVar5 = has_root_directory(this);
    bVar6 = has_root_directory(p);
    if (bVar5 == bVar6) {
      lVar11 = (long)(int)((int)psVar8 + (uint)bVar5);
      pcVar3 = (this->_path)._M_dataplus._M_p;
      lVar14 = (long)(int)((int)sVar9 + (uint)bVar5);
      pcVar4 = (p->_path)._M_dataplus._M_p;
      lVar13 = (p->_path)._M_string_length - lVar14;
      lVar10 = (this->_path)._M_string_length - lVar11;
      for (lVar12 = 0;
          ((lVar10 != lVar12 && (lVar13 != lVar12)) &&
          (pcVar3[lVar12 + lVar11] == pcVar4[lVar12 + lVar14])); lVar12 = lVar12 + 1) {
      }
      if (lVar10 == lVar12) {
        uVar7 = -(uint)(lVar13 != lVar12);
      }
      else {
        uVar7 = 1;
        if (lVar13 != lVar12) {
          cVar1 = pcVar3[lVar12 + lVar11];
          if (cVar1 == '/') {
            uVar7 = 0xffffffff;
          }
          else {
            cVar2 = pcVar4[lVar12 + lVar14];
            if (cVar2 != '/') {
              uVar7 = (uint)(cVar2 <= cVar1) * 2 - 1;
            }
          }
        }
      }
    }
    else {
      uVar7 = bVar5 - 1 | 1;
    }
  }
  return uVar7;
}

Assistant:

GHC_INLINE int path::compare(const path& p) const noexcept
{
#ifdef LWG_2936_BEHAVIOUR
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
#ifdef GHC_OS_WINDOWS
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
#else
    auto rnc = _path.compare(0, rnl1, p._path, 0, (std::min(rnl1, rnl2)));
#endif
    if (rnc) {
        return rnc;
    }
    bool hrd1 = has_root_directory(), hrd2 = p.has_root_directory();
    if (hrd1 != hrd2) {
        return hrd1 ? 1 : -1;
    }
    if (hrd1) {
        ++rnl1;
        ++rnl2;
    }
    auto iter1 = _path.begin() + static_cast<int>(rnl1);
    auto iter2 = p._path.begin() + static_cast<int>(rnl2);
    while (iter1 != _path.end() && iter2 != p._path.end() && *iter1 == *iter2) {
        ++iter1;
        ++iter2;
    }
    if (iter1 == _path.end()) {
        return iter2 == p._path.end() ? 0 : -1;
    }
    if (iter2 == p._path.end()) {
        return 1;
    }
    if (*iter1 == preferred_separator) {
        return -1;
    }
    if (*iter2 == preferred_separator) {
        return 1;
    }
    return *iter1 < *iter2 ? -1 : 1;
#else  // LWG_2936_BEHAVIOUR
#ifdef GHC_OS_WINDOWS
    auto rnl1 = root_name_length();
    auto rnl2 = p.root_name_length();
    auto rnc = detail::compare_simple_insensitive(_path.c_str(), rnl1, p._path.c_str(), rnl2);
    if (rnc) {
        return rnc;
    }
    return _path.compare(rnl1, std::string::npos, p._path, rnl2, std::string::npos);
#else
    return _path.compare(p._path);
#endif
#endif
}